

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O2

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
slice_projection::evaluate
          (slice_projection *this,reference val,
          eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
          *context,error_code *ec)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this_00;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar5;
  reference pbVar6;
  reference pbVar7;
  int64_t i_1;
  int64_t i;
  size_t local_58;
  reference local_40;
  slice_projection *local_38;
  
  bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(val);
  if (bVar2) {
    sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
    sVar3 = slice::get_start(&this->slice_,sVar3);
    sVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
    local_58 = slice::get_stop(&this->slice_,sVar4);
    lVar1 = (this->slice_).step_;
    if (lVar1 != 0) {
      this_00 = (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                ::create_json<jsoncons::json_array_arg_t_const&>
                          ((eval_context<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
                            *)context,(json_array_arg_t *)&json_array_arg);
      if (lVar1 < 1) {
        local_38 = this;
        sVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
        if ((long)sVar4 <= (long)sVar3) {
          sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
          sVar3 = sVar3 - 1;
        }
        sVar4 = 0xffffffffffffffff;
        if (-1 < (long)local_58) {
          sVar4 = local_58;
        }
        for (; (long)sVar4 < (long)sVar3; sVar3 = sVar3 + lVar1) {
          pbVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(val,sVar3);
          pbVar6 = projection_base::apply_expressions
                             (&local_38->super_projection_base,pbVar5,context,ec);
          bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null(pbVar6);
          if (!bVar2) {
            local_40 = pbVar6;
            basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
            emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*>
                      (this_00,(json_const_pointer_arg_t *)&json_const_pointer_arg,&local_40);
          }
        }
      }
      else {
        sVar4 = 0;
        if (0 < (long)sVar3) {
          sVar4 = sVar3;
        }
        sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
        if ((long)sVar3 < (long)local_58) {
          local_58 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(val);
        }
        for (; (long)sVar4 < (long)local_58; sVar4 = sVar4 + lVar1) {
          pbVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(val,sVar4);
          pbVar6 = projection_base::apply_expressions
                             (&this->super_projection_base,pbVar5,context,ec);
          bVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_null(pbVar6);
          if (!bVar2) {
            local_40 = pbVar6;
            basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
            emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const*>
                      (this_00,(json_const_pointer_arg_t *)&json_const_pointer_arg,&local_40);
          }
        }
      }
      return (reference)this_00;
    }
    std::error_code::operator=(ec,step_cannot_be_zero);
  }
  pbVar7 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar7;
}

Assistant:

reference evaluate(reference val, eval_context<Json>& context, std::error_code& ec) const override
            {
                if (!val.is_array())
                {
                    return context.null_value();
                }

                auto start = slice_.get_start(val.size());
                auto end = slice_.get_stop(val.size());
                auto step = slice_.step();

                if (step == 0)
                {
                    ec = jmespath_errc::step_cannot_be_zero;
                    return context.null_value();
                }

                auto result = context.create_json(json_array_arg);
                if (step > 0)
                {
                    if (start < 0)
                    {
                        start = 0;
                    }
                    if (end > static_cast<int64_t>(val.size()))
                    {
                        end = val.size();
                    }
                    for (int64_t i = start; i < end; i += step)
                    {
                        reference j = this->apply_expressions(val.at(static_cast<std::size_t>(i)), context, ec);
                        if (!j.is_null())
                        {
                            result->emplace_back(json_const_pointer_arg, std::addressof(j));
                        }
                    }
                }
                else
                {
                    if (start >= static_cast<int64_t>(val.size()))
                    {
                        start = static_cast<int64_t>(val.size()) - 1;
                    }
                    if (end < -1)
                    {
                        end = -1;
                    }
                    for (int64_t i = start; i > end; i += step)
                    {
                        reference j = this->apply_expressions(val.at(static_cast<std::size_t>(i)), context, ec);
                        if (!j.is_null())
                        {
                            result->emplace_back(json_const_pointer_arg, std::addressof(j));
                        }
                    }
                }

                return *result;
            }